

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusargument.h
# Opt level: O2

QDBusArgument * operator>>(QDBusArgument *arg,QList<QList<QString>_> *list)

{
  char cVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QDBusArgument::beginArray();
  QList<QList<QString>_>::clear(list);
  while( true ) {
    cVar1 = QDBusArgument::atEnd();
    if (cVar1 != '\0') break;
    local_38.d = (Data *)0x0;
    local_38.ptr = (QString *)0x0;
    local_38.size = 0;
    QDBusArgument::operator>>(arg,(QList_conflict1 *)&local_38);
    QList<QList<QString>>::emplaceBack<QList<QString>const&>
              ((QList<QList<QString>> *)list,(QList<QString> *)&local_38);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_38);
  }
  QDBusArgument::endArray();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return arg;
  }
  __stack_chk_fail();
}

Assistant:

inline const QDBusArgument &operator>>(const QDBusArgument &arg, Container<T> &list)
{
    arg.beginArray();
    list.clear();
    while (!arg.atEnd()) {
        T item;
        arg >> item;
        list.push_back(item);
    }

    arg.endArray();
    return arg;
}